

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::fieldidx<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseInput *ctx)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  optional<unsigned_int> oVar3;
  string local_68;
  undefined1 local_48 [8];
  optional<wasm::Name> id;
  
  oVar3 = ParseInput::takeU32(ctx);
  if ((((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) ||
     (ParseInput::takeID((optional<wasm::Name> *)local_48,ctx),
     id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
     super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01')) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) = '\0';
    return __return_storage_ptr__;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"expected field index or identifier","");
  ParseInput::err((Err *)local_48,ctx,&local_68);
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
  puVar2 = (undefined1 *)
           ((long)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload + 8);
  if (local_48 == (undefined1  [8])puVar2) {
    *puVar1 = CONCAT71(id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                       id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18) =
         id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._16_8_;
  }
  else {
    *(undefined1 (*) [8])
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = local_48;
    *(ulong *)((long)&(__return_storage_ptr__->val).
                      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x10
              ) = CONCAT71(id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                           id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
  }
  *(size_t *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
       id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
  id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len = 0;
  id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._8_1_ = 0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) = '\x01';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    return __return_storage_ptr__;
  }
  local_48 = (undefined1  [8])puVar2;
  operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldIdxT> fieldidx(Ctx& ctx,
                                         typename Ctx::HeapTypeT type) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getFieldFromIdx(type, *x);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getFieldFromName(type, *id);
  }
  return ctx.in.err("expected field index or identifier");
}